

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

If * __thiscall
wasm::Builder::makeIf(Builder *this,Expression *condition,Expression *ifTrue,Expression *ifFalse)

{
  If *this_00;
  
  this_00 = MixedArena::alloc<wasm::If>(&this->wasm->allocator);
  this_00->condition = condition;
  this_00->ifTrue = ifTrue;
  this_00->ifFalse = ifFalse;
  If::finalize(this_00);
  return this_00;
}

Assistant:

If* makeIf(Expression* condition,
             Expression* ifTrue,
             Expression* ifFalse = nullptr) {
    auto* ret = wasm.allocator.alloc<If>();
    ret->condition = condition;
    ret->ifTrue = ifTrue;
    ret->ifFalse = ifFalse;
    ret->finalize();
    return ret;
  }